

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O3

bool __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::erase
          (KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *pt,long *v)

{
  Node *n;
  
  n = this->root;
  if (n == (Node *)0x0) {
    return false;
  }
  while ((((n->pt).field_0.x != (pt->field_0).x || ((n->pt).field_1.y != (pt->field_1).y)) ||
         (n->value != *v))) {
    n = (&n->before)[(&(n->pt).field_0)[n->dim].x <= (&pt->field_0)[n->dim].x];
    if (n == (Node *)0x0) {
      return false;
    }
  }
  delete_node(this,n);
  return true;
}

Assistant:

bool KDTree<CoordType, ValueType>::erase(
    const CoordType& pt, const ValueType& v) {
  if (this->root == nullptr) {
    return false;
  }

  for (Node* n = this->root; n != nullptr;) {
    if ((n->pt == pt) && (n->value == v)) {
      this->delete_node(n);
      return true;
    }
    n = (pt.at(n->dim) < n->pt.at(n->dim)) ? n->before : n->after_or_equal;
  }
  return false;
}